

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  size_t sVar5;
  long lVar6;
  uint uVar7;
  uint *__s;
  int iVar8;
  uchar *outstart;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  char nbuf [16];
  uint local_48 [4];
  int *local_38;
  
  iVar2 = -1;
  if (inlen != (int *)0x0 && (outlen != (int *)0x0 && out != (uchar *)0x0)) {
    local_38 = inlen;
    if (in == (uchar *)0x0) {
      *outlen = 0;
      iVar11 = 0;
      iVar2 = 0;
    }
    else {
      iVar11 = (int)in;
      iVar8 = (int)out;
      if (0 < (long)*inlen) {
        pbVar12 = in + *inlen;
        pbVar9 = out + *outlen;
        pbVar10 = out;
        do {
          __s = local_48;
          bVar1 = *in;
          out = pbVar10;
          if ((char)bVar1 < '\0') {
            lVar6 = 4 - (ulong)(bVar1 < 0xf0);
            if (bVar1 < 0xe0) {
              lVar6 = 2;
            }
            lVar3 = 3;
            if (lVar6 <= (long)pbVar12 - (long)in) {
              uVar7 = (uint)(bVar1 < 0xf0) * 8 + 7;
              if (bVar1 < 0xe0) {
                uVar7 = 0x1f;
              }
              uVar7 = uVar7 & bVar1;
              lVar3 = 1;
              do {
                uVar7 = in[lVar3] & 0x3f | uVar7 << 6;
                lVar3 = lVar3 + 1;
              } while (lVar6 != lVar3);
              local_48[0] = uVar7;
              pvVar4 = bsearch(__s,html40EntitiesTable,0xfd,0x18,htmlCompareEntityDesc);
              if (pvVar4 == (void *)0x0) {
                snprintf((char *)__s,0x10,"#%u",(ulong)uVar7);
              }
              else {
                __s = *(uint **)((long)pvVar4 + 8);
              }
              sVar5 = strlen((char *)__s);
              lVar3 = 4;
              if ((long)((sVar5 << 0x20) + 0x200000000) >> 0x20 <= (long)pbVar9 - (long)pbVar10) {
                *pbVar10 = 0x26;
                sVar5 = (long)(sVar5 << 0x20) >> 0x20;
                memcpy(pbVar10 + 1,__s,sVar5);
                out = pbVar10 + sVar5 + 2;
                pbVar10[sVar5 + 1] = 0x3b;
                in = in + lVar6;
                lVar3 = 0;
              }
            }
          }
          else {
            lVar3 = 4;
            if (pbVar10 < pbVar9) {
              *pbVar10 = bVar1;
              in = in + 1;
              lVar3 = 2;
              out = pbVar10 + 1;
            }
          }
          lVar6 = lVar3;
          if (4 < (uint)lVar3) {
switchD_001694a4_caseD_1:
            return (int)lVar6;
          }
          lVar6 = (long)&switchD_001694a4::switchdataD_001d3630 +
                  (long)(int)(&switchD_001694a4::switchdataD_001d3630)[lVar3];
          switch(lVar3) {
          case 1:
            goto switchD_001694a4_caseD_1;
          case 3:
            goto switchD_001694a4_caseD_3;
          case 4:
            iVar2 = -3;
            goto LAB_001694b4;
          }
          pbVar10 = out;
        } while (in < pbVar12);
      }
switchD_001694a4_caseD_3:
      iVar2 = (int)out - iVar8;
LAB_001694b4:
      *outlen = (int)out - iVar8;
      iVar11 = (int)in - iVar11;
    }
    *local_38 = iVar11;
  }
  return iVar2;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen) {
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned char* outstart = out;
    unsigned char* outend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        const htmlEntityDesc *ent;
        const char *cp;
        char nbuf[16];
        unsigned c, d;
        int seqlen, len, i;

	d = *in;

	if (d < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = d;
            in += 1;
            continue;
        }

        if (d < 0xE0)      { c = d & 0x1F; seqlen = 2; }
        else if (d < 0xF0) { c = d & 0x0F; seqlen = 3; }
        else               { c = d & 0x07; seqlen = 4; }

	if (inend - in < seqlen)
	    break;

	for (i = 1; i < seqlen; i++) {
	    d = in[i];
	    c <<= 6;
	    c |= d & 0x3F;
	}

        /*
         * Try to lookup a predefined HTML entity for it
         */
        ent = htmlEntityValueLookup(c);

        if (ent == NULL) {
          snprintf(nbuf, sizeof(nbuf), "#%u", c);
          cp = nbuf;
        } else {
          cp = ent->name;
        }

        len = strlen(cp);
        if (outend - out < len + 2)
            goto done;

        *out++ = '&';
        memcpy(out, cp, len);
        out += len;
        *out++ = ';';

        in += seqlen;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}